

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O1

bool __thiscall SimpleConfigLoader::loadConfiguration(SimpleConfigLoader *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_t sVar4;
  char *pcVar5;
  Configuration *pCVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  SimpleConfigLoader *pSVar9;
  string *this_00;
  _Alloc_hider _Var10;
  long lVar11;
  bool boolValue;
  string stringName;
  string stringValue;
  char fileBuf [1024];
  bool local_559;
  undefined1 *local_558;
  long local_550;
  undefined1 local_548 [16];
  char *local_538;
  long local_530;
  char local_528 [16];
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  SimpleConfigLoader local_438 [129];
  
  pcVar3 = getConfigPath(this);
  __stream = fopen(pcVar3,"r");
  if (__stream == (FILE *)0x0) {
    softHSMLog(3,"loadConfiguration",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
               ,0x54,"Could not open the config file: %s",pcVar3);
    free(pcVar3);
  }
  else {
    free(pcVar3);
    pcVar3 = fgets((char *)local_438,0x400,__stream);
    if (pcVar3 != (char *)0x0) {
      lVar11 = 1;
      do {
        sVar4 = strcspn((char *)local_438,"#\n\r");
        *(undefined1 *)((long)&local_438[0].super_ConfigLoader._vptr_ConfigLoader + sVar4) = 0;
        if ((char)local_438[0].super_ConfigLoader._vptr_ConfigLoader == '\0') goto LAB_0014d65d;
        pSVar9 = local_438;
        pcVar3 = strtok((char *)local_438,"=");
        if (pcVar3 == (char *)0x0) {
          iVar2 = 0x73;
LAB_0014d3fe:
          softHSMLog(4,"loadConfiguration",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                     ,iVar2,"Bad format on line %lu, skip",lVar11);
          goto LAB_0014d65d;
        }
        pcVar3 = trimString(pSVar9,pcVar3);
        if (pcVar3 == (char *)0x0) {
          iVar2 = 0x7b;
          goto LAB_0014d3fe;
        }
        pSVar9 = (SimpleConfigLoader *)0x0;
        pcVar5 = strtok((char *)0x0,"=");
        if (pcVar5 == (char *)0x0) {
          iVar2 = 0x82;
LAB_0014d446:
          softHSMLog(4,"loadConfiguration",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                     ,iVar2,"Bad format on line %lu, skip",lVar11);
          free(pcVar3);
          goto LAB_0014d65d;
        }
        pcVar5 = trimString(pSVar9,pcVar5);
        if (pcVar5 == (char *)0x0) {
          iVar2 = 0x8b;
          goto LAB_0014d446;
        }
        local_558 = local_548;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,pcVar3,pcVar3 + sVar4);
        local_538 = local_528;
        sVar4 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,pcVar5,pcVar5 + sVar4);
        free(pcVar3);
        free(pcVar5);
        pCVar6 = Configuration::i();
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_498,local_558,local_558 + local_550);
        iVar2 = Configuration::getType(pCVar6,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        switch(iVar2) {
        case 1:
          pCVar6 = Configuration::i();
          local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b8,local_558,local_558 + local_550);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_478,local_538,local_538 + local_530);
          Configuration::setString(pCVar6,&local_4b8,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p);
          }
          paVar8 = &local_4b8.field_2;
          _Var10._M_p = local_4b8._M_dataplus._M_p;
          break;
        case 2:
          pCVar6 = Configuration::i();
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4d8,local_558,local_558 + local_550);
          iVar2 = atoi(local_538);
          Configuration::setInt(pCVar6,&local_4d8,iVar2);
          paVar8 = &local_4d8.field_2;
          _Var10._M_p = local_4d8._M_dataplus._M_p;
          break;
        case 3:
          pCVar6 = Configuration::i();
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4f8,local_558,local_558 + local_550);
          lVar7 = strtol(local_538,(char **)0x0,8);
          Configuration::setInt(pCVar6,&local_4f8,(int)lVar7);
          paVar8 = &local_4f8.field_2;
          _Var10._M_p = local_4f8._M_dataplus._M_p;
          break;
        case 4:
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          this_00 = &local_458;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)this_00,local_538,local_538 + local_530);
          bVar1 = string2bool((SimpleConfigLoader *)this_00,&local_458,&local_559);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          if (bVar1) {
            pCVar6 = Configuration::i();
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_518,local_558,local_558 + local_550);
            Configuration::setBool(pCVar6,&local_518,local_559);
            paVar8 = &local_518.field_2;
            _Var10._M_p = local_518._M_dataplus._M_p;
            break;
          }
          softHSMLog(4,"loadConfiguration",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                     ,0xa9,"The value %s is not a boolean",local_538);
          goto LAB_0014d635;
        default:
          softHSMLog(4,"loadConfiguration",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/SimpleConfigLoader.cpp"
                     ,0xaf,"The following configuration is not supported: %s = %s",local_558,
                     local_538);
          goto LAB_0014d635;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != paVar8) {
          operator_delete(_Var10._M_p);
        }
LAB_0014d635:
        if (local_538 != local_528) {
          operator_delete(local_538);
        }
        if (local_558 != local_548) {
          operator_delete(local_558);
        }
LAB_0014d65d:
        pcVar3 = fgets((char *)local_438,0x400,__stream);
        lVar11 = lVar11 + 1;
      } while (pcVar3 != (char *)0x0);
    }
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool SimpleConfigLoader::loadConfiguration()
{
	char* configPath = getConfigPath();

	FILE* fp = fopen(configPath,"r");

	if (fp == NULL)
	{
		ERROR_MSG("Could not open the config file: %s", configPath);
		free(configPath);
		return false;
	}
	free(configPath);

	char fileBuf[1024];

	// Format in config file
	//
	// <name> = <value>
	// # Line is ignored

	size_t line = 0;
	while (fgets(fileBuf, sizeof(fileBuf), fp) != NULL)
	{
		line++;

		// End the string at the first comment or newline
		fileBuf[strcspn(fileBuf, "#\n\r")] = '\0';

		// Skip empty lines
		if (fileBuf[0] == '\0')
		{
			continue;
		}

		// Get the first part of the line
		char* name = strtok(fileBuf, "=");
		if (name == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Trim the name
		char* trimmedName = trimString(name);
		if (trimmedName == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			continue;
		}

		// Get the second part of the line
		char* value = strtok(NULL, "=");
		if(value == NULL) {
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Trim the value
		char* trimmedValue = trimString(value);
		if (trimmedValue == NULL)
		{
			WARNING_MSG("Bad format on line %lu, skip", (unsigned long)line);
			free(trimmedName);
			continue;
		}

		// Save name,value
		std::string stringName(trimmedName);
		std::string stringValue(trimmedValue);
		free(trimmedName);
		free(trimmedValue);

		switch (Configuration::i()->getType(stringName))
		{
			case CONFIG_TYPE_STRING:
				Configuration::i()->setString(stringName, stringValue);
				break;
			case CONFIG_TYPE_INT:
				Configuration::i()->setInt(stringName, atoi(stringValue.c_str()));
				break;
			case CONFIG_TYPE_INT_OCTAL:
				Configuration::i()->setInt(stringName, strtol(stringValue.c_str(), NULL, 8));
				break;
			case CONFIG_TYPE_BOOL:
				bool boolValue;
				if (string2bool(stringValue, &boolValue))
				{
					Configuration::i()->setBool(stringName, boolValue);
				}
				else
				{
					WARNING_MSG("The value %s is not a boolean", stringValue.c_str());
				}
				break;
			case CONFIG_TYPE_UNSUPPORTED:
			default:
				WARNING_MSG("The following configuration is not supported: %s = %s",
					stringName.c_str(), stringValue.c_str());
				break;
		}
	}

	fclose(fp);

	return true;
}